

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialNormalAttributeDecoder::DecodeIntegerValues
          (SequentialNormalAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  
  if (((this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.decoder_)->
      version_major_ < 2) {
    bVar1 = AttributeOctahedronTransform::DecodeParameters
                      (&this->octahedral_transform_,
                       (this->super_SequentialIntegerAttributeDecoder).
                       super_SequentialAttributeDecoder.attribute_,in_buffer);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = SequentialIntegerAttributeDecoder::DecodeIntegerValues
                    (&this->super_SequentialIntegerAttributeDecoder,point_ids,in_buffer);
  return bVar1;
}

Assistant:

bool SequentialNormalAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    // Note: in older bitstreams, we do not have a PortableAttribute() decoded
    // at this stage so we cannot pass it down to the DecodeParameters() call.
    // It still works fine for octahedral transform because it does not need to
    // use any data from the attribute.
    if (!octahedral_transform_.DecodeParameters(*attribute(), in_buffer)) {
      return false;
    }
  }
#endif
  return SequentialIntegerAttributeDecoder::DecodeIntegerValues(point_ids,
                                                                in_buffer);
}